

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<MiniSTOptions>::insert_simplex_and_subfaces<short[4]>
          (Simplex_tree<MiniSTOptions> *this,short (*Nsimplex) [4],Filtration_value *filtration)

{
  short sVar1;
  long lVar2;
  short *psVar3;
  Filtration_value *filt;
  int iVar4;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> _Var5;
  undefined8 *puVar6;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> _Var7;
  const_iterator __position;
  long *in_FS_OFFSET;
  pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_bool>
  pVar8;
  
  if ((char)in_FS_OFFSET[-0x19] == '\0') {
    in_FS_OFFSET[-0x1a] = 0;
    in_FS_OFFSET[-0x1c] = 0;
    in_FS_OFFSET[-0x1b] = 0;
    __cxa_thread_atexit(std::vector<short,_std::allocator<short>_>::~vector,*in_FS_OFFSET + -0xe0,
                        &__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x19) = 1;
  }
  lVar2 = *in_FS_OFFSET;
  psVar3 = (short *)in_FS_OFFSET[-0x1c];
  __position._M_current = (short *)in_FS_OFFSET[-0x1b];
  if ((short *)in_FS_OFFSET[-0x1b] != psVar3) {
    in_FS_OFFSET[-0x1b] = (long)psVar3;
    __position._M_current = psVar3;
  }
  std::vector<short,std::allocator<short>>::insert<short_const*,void>
            ((vector<short,std::allocator<short>> *)(lVar2 + -0xe0),__position,(short *)filtration,
             (short *)(filtration + 1));
  std::
  __sort<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (in_FS_OFFSET[-0x1c],in_FS_OFFSET[-0x1b]);
  _Var5 = std::
          __unique<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    (in_FS_OFFSET[-0x1c],in_FS_OFFSET[-0x1b]);
  std::vector<short,_std::allocator<short>_>::erase
            ((vector<short,_std::allocator<short>_> *)(lVar2 + -0xe0),
             (const_iterator)_Var5._M_current,(short *)in_FS_OFFSET[-0x1b]);
  _Var5._M_current = (short *)in_FS_OFFSET[-0x1c];
  filt = (Filtration_value *)in_FS_OFFSET[-0x1b];
  _Var7._M_current = _Var5._M_current;
  do {
    if ((Filtration_value *)_Var7._M_current == filt) {
      iVar4 = (int)((ulong)((long)filt - (long)_Var5._M_current) >> 1) + -1;
      if (iVar4 < *(int *)Nsimplex[0x10]) {
        iVar4 = *(int *)Nsimplex[0x10];
      }
      *(int *)Nsimplex[0x10] = iVar4;
      pVar8 = rec_insert_simplex_and_subfaces_sorted<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>>
                        (this,(Siblings *)Nsimplex,
                         (__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>)
                         (Nsimplex + 8),_Var5,filt);
      pVar8.first.m_ptr =
           (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>
            *)this;
      return pVar8;
    }
    sVar1 = *_Var7._M_current;
    _Var7._M_current = (short *)((long)_Var7._M_current + 2);
  } while (sVar1 != Nsimplex[7][0]);
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = "cannot use the dummy null_vertex() as a real vertex";
  __cxa_throw(puVar6,&char_const*::typeinfo,0);
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex_and_subfaces(
      const InputVertexRange& Nsimplex,
      const Filtration_value& filtration = Filtration_value())
  {
    auto first = std::begin(Nsimplex);
    auto last = std::end(Nsimplex);

    if (first == last)
      return { null_simplex(), true }; // FIXME: false would make more sense to me.

    thread_local std::vector<Vertex_handle> copy;
    copy.clear();
    copy.insert(copy.end(), first, last);
    std::sort(copy.begin(), copy.end());
    auto last_unique = std::unique(copy.begin(), copy.end());
    copy.erase(last_unique, copy.end());
    GUDHI_CHECK_code(
      for (Vertex_handle v : copy)
        GUDHI_CHECK(v != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
    )
    // Update dimension if needed. We could wait to see if the insertion succeeds, but I doubt there is much to gain.
    dimension_ = (std::max)(dimension_, static_cast<int>(std::distance(copy.begin(), copy.end())) - 1);

    return rec_insert_simplex_and_subfaces_sorted(root(), copy.begin(), copy.end(), filtration);
  }